

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec-common.c
# Opt level: O3

void cpu_loop_exit_aarch64(CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  int iVar2;
  
  puVar1 = cpu->uc;
  iVar2 = puVar1->nested_level;
  if (iVar2 == 1) {
    tb_exec_unlock_aarch64((TCGContext_conflict1 *)puVar1->tcg_ctx);
    puVar1 = cpu->uc;
    iVar2 = puVar1->nested_level;
  }
  cpu->can_do_io = 1;
  siglongjmp((__jmp_buf_tag *)(puVar1->jmp_bufs + (iVar2 + -1)),1);
}

Assistant:

void cpu_loop_exit(CPUState *cpu)
{
    /* Unlock JIT write protect if applicable. */
    if (cpu->uc->nested_level == 1) {
        tb_exec_unlock(cpu->uc->tcg_ctx);
    }
    /* Undo the setting in cpu_tb_exec.  */
    cpu->can_do_io = 1;
    siglongjmp(cpu->uc->jmp_bufs[cpu->uc->nested_level - 1], 1);
}